

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

int wasm_eval(uint8_t *digitPtr)

{
  void *__dest;
  ggml_opt_dataset_t dataset;
  long lVar1;
  size_t __n;
  undefined8 uVar2;
  ggml_opt_result_t pgVar3;
  allocator<char> local_142;
  allocator<char> local_141;
  int32_t pred;
  string local_120;
  vector<float,_std::allocator<float>_> digit;
  mnist_model model;
  
  std::vector<float,std::allocator<float>>::vector<unsigned_char*,void>
            ((vector<float,std::allocator<float>> *)&digit,digitPtr,digitPtr + 0x310,
             (allocator_type *)&model);
  dataset = (ggml_opt_dataset_t)ggml_opt_dataset_init(0x310,10,1);
  lVar1 = ggml_opt_dataset_data(dataset);
  __dest = *(void **)(lVar1 + 0xf8);
  __n = ggml_nbytes(lVar1);
  memcpy(__dest,digitPtr,__n);
  uVar2 = ggml_opt_dataset_labels(dataset);
  ggml_set_zero(uVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&pred,"mnist-f32.gguf",&local_141);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"CPU",&local_142);
  mnist_model_init_from_file(&model,(string *)&pred,&local_120,1,1);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&pred);
  mnist_model_build(&model);
  pgVar3 = mnist_model_eval(&model,dataset);
  ggml_opt_result_pred(pgVar3,&pred);
  mnist_model::~mnist_model(&model);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&digit.super__Vector_base<float,_std::allocator<float>_>);
  return pred;
}

Assistant:

int wasm_eval(uint8_t * digitPtr) {
    std::vector<float> digit(digitPtr, digitPtr + MNIST_NINPUT);

    ggml_opt_dataset_t dataset = ggml_opt_dataset_init(MNIST_NINPUT, MNIST_NCLASSES, 1, 1);
    struct ggml_tensor * data = ggml_opt_dataset_data(dataset);
    memcpy(data->data, digitPtr, ggml_nbytes(data));
    ggml_set_zero(ggml_opt_dataset_labels(dataset)); // The labels are not needed.

    mnist_model model = mnist_model_init_from_file("mnist-f32.gguf", "CPU", /*nbatch_logical =*/ 1, /*nbatch_physical =*/ 1);
    mnist_model_build(model);
    ggml_opt_result_t result = mnist_model_eval(model, dataset);

    int32_t pred;
    ggml_opt_result_pred(result, &pred);

    return pred;
}